

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void skip_nl(c2m_ctx_t c2m_ctx,token_t t,VARR_token_t *buffer)

{
  short sVar1;
  ushort uVar2;
  VARR_macro_call_t *pVVar3;
  MIR_context_t pMVar4;
  MIR_error_func_t p_Var5;
  uint *puVar6;
  VARR_token_t *pVVar7;
  pre_ctx *ppVar8;
  macro_t pmVar9;
  size_t sVar10;
  ulong uVar11;
  token_arr_t pVVar12;
  token_t *pptVar13;
  VARR_char *pVVar14;
  VARR_char *pVVar15;
  pos_t pVar16;
  gen_ctx **ppgVar17;
  char cVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  token_t ptVar23;
  ulong uVar24;
  token_t *pptVar25;
  long lVar26;
  c2m_ctx_t pcVar27;
  MIR_context_t pMVar28;
  token_t t_00;
  macro_call_t pmVar29;
  VARR_token_arr_t *pVVar30;
  token_arr_t *ppVVar31;
  gen_ctx *pgVar32;
  MIR_item_t pMVar33;
  c2m_ctx_t pcVar34;
  ulong uVar35;
  macro_call_t *ppmVar36;
  undefined1 *puVar37;
  char *pcVar38;
  char *pcVar39;
  node_t_conflict pnVar40;
  undefined4 *puVar41;
  long *plVar42;
  undefined8 *puVar43;
  void *pvVar44;
  uint uVar45;
  c2m_ctx_t pcVar46;
  uint uVar47;
  token_t t_01;
  char *format;
  long extraout_RDX;
  uint uVar48;
  c2m_ctx_t pcVar49;
  c2m_ctx_t pcVar50;
  MIR_item_t pMVar51;
  char *pcVar52;
  char **in_R8;
  size_t sVar53;
  token_t t_02;
  MIR_context_t pMVar54;
  c2m_ctx_t pcVar55;
  MIR_context_t pMVar56;
  size_t sVar57;
  char *pcVar58;
  bool bVar59;
  str_t sVar60;
  char *pcStack_1a0;
  size_t sStack_198;
  MIR_context_t pMStack_108;
  uint uStack_94;
  
  ptVar23 = t;
  if (t != (token_t)0x0) goto LAB_00192ca6;
  while( true ) {
    do {
      t = (token_t)0x0;
      ptVar23 = get_next_pptoken_1(c2m_ctx,0);
LAB_00192ca6:
      if ((*(short *)ptVar23 == 10) || (*(short *)ptVar23 == 0x147)) {
        unget_next_pptoken(c2m_ctx,ptVar23);
        return;
      }
    } while (buffer == (VARR_token_t *)0x0);
    pcVar49 = (c2m_ctx_t)buffer->varr;
    if (pcVar49 == (c2m_ctx_t)0x0) break;
    uVar24 = buffer->els_num + 1;
    if (buffer->size < uVar24) {
      sVar53 = (uVar24 >> 1) + uVar24;
      pptVar25 = (token_t *)realloc(pcVar49,sVar53 * 8);
      buffer->varr = pptVar25;
      buffer->size = sVar53;
    }
    sVar53 = buffer->els_num;
    buffer->els_num = sVar53 + 1;
    buffer->varr[sVar53] = ptVar23;
  }
  skip_nl_cold_1();
  pVVar3 = pcVar49->pre_ctx->macro_call_stack;
  if (((pVVar3 != (VARR_macro_call_t *)0x0) && (pVVar3->varr != (macro_call_t *)0x0)) &&
     (sVar53 = pVVar3->els_num, sVar53 != 0)) {
    pVVar3->els_num = sVar53 - 1;
    pmVar29 = pVVar3->varr[sVar53 - 1];
    pmVar29->macro->ignore_p = 0;
    free_macro_call(pmVar29);
    return;
  }
  pop_macro_call_cold_1();
  pMVar4 = ((c2m_ctx_t)t)->ctx;
  pcVar52 = (char *)pMVar4->error_func;
  pcVar50 = (c2m_ctx_t)t;
  pcVar34 = pcVar49;
  if ((MIR_context_t)pcVar52 != (MIR_context_t)0x0) {
    iVar22 = *(int *)&((MIR_context_t)pcVar52)->gen_ctx;
    iVar19 = *(int *)(((c2m_ctx_t)t)->env[0].__jmpbuf + 2);
    if (iVar19 < iVar22) {
      p_Var5 = ((MIR_context_t)pcVar52)->error_func;
      uStack_94 = 0xffffffff;
      do {
        pcVar52 = (char *)(ulong)(iVar19 + 1U);
        *(uint *)(((c2m_ctx_t)t)->env[0].__jmpbuf + 2) = iVar19 + 1U;
        pcVar27 = *(c2m_ctx_t *)(p_Var5 + (long)iVar19 * 8);
        sVar1 = *(short *)&pcVar27->ctx;
        if (sVar1 == 0x103) {
          pcVar34 = (c2m_ctx_t)pMVar4->c2mir_ctx;
          pcVar55 = (c2m_ctx_t)pcVar27->env[0].__jmpbuf[3];
          uVar20 = find_param((VARR_token_t *)pcVar34,(char *)pcVar55);
          if ((int)uVar20 < 0) {
            bVar59 = false;
            goto LAB_00193440;
          }
          pcVar52 = (char *)((c2m_ctx_t)t)->env[0].__jmpbuf[1];
          if ((((MIR_context_t)pcVar52 == (MIR_context_t)0x0) ||
              (((MIR_context_t)pcVar52)->error_func == (MIR_error_func_t)0x0)) ||
             (((MIR_context_t)pcVar52)->gen_ctx <= (gen_ctx *)(ulong)uVar20)) {
LAB_001935ae:
            process_replacement_cold_19();
LAB_001935b3:
            process_replacement_cold_9();
LAB_001935b8:
            process_replacement_cold_10();
LAB_001935bd:
            process_replacement_cold_3();
LAB_001935c2:
            process_replacement_cold_7();
LAB_001935c7:
            process_replacement_cold_12();
LAB_001935cc:
            process_replacement_cold_2();
LAB_001935d1:
            process_replacement_cold_8();
            pcVar50 = pcVar55;
            goto LAB_001935d6;
          }
          pcVar55 = *(c2m_ctx_t *)(((MIR_context_t)pcVar52)->error_func + (long)(ulong)uVar20 * 8);
          if (-1 < (int)uStack_94) {
            pcVar50 = (c2m_ctx_t)(ulong)uStack_94;
            del_tokens((VARR_token_t *)((c2m_ctx_t)t)->env[0].__jmpbuf[3],uStack_94,-1);
            pcVar34 = pcVar55;
            if (pcVar55 == (c2m_ctx_t)0x0) goto LAB_001935f4;
            if (pcVar55->ctx != (MIR_context_t)0x0) {
              pptVar25 = (token_t *)pcVar55->env[0].__jmpbuf[0];
              if (pptVar25 == (token_t *)0x0) goto LAB_001935fe;
              sVar1 = *(short *)*pptVar25;
              if ((sVar1 == 0x20) || (sVar1 == 10)) {
                pcVar50 = (c2m_ctx_t)0x0;
                del_tokens((VARR_token_t *)pcVar55,0,1);
              }
            }
            pMVar28 = pcVar55->ctx;
            if (pMVar28 != (MIR_context_t)0x0) {
              pcVar52 = (char *)pcVar55->env[0].__jmpbuf[0];
              if ((MIR_context_t)pcVar52 == (MIR_context_t)0x0) goto LAB_00193603;
              uVar2 = **(ushort **)((long)pcVar52 + (long)pMVar28 * 8 + -8);
              pcVar52 = (char *)(ulong)uVar2;
              if ((uVar2 == 0x20) || (uVar2 == 10)) {
                pcVar55->ctx = (MIR_context_t)((long)&pMVar28[-1].wrapper_end_addr + 7);
              }
            }
            if (pcVar55->ctx == (MIR_context_t)0x0) {
              pMVar28 = ((c2m_ctx_t)t)->ctx;
            }
            else {
              pMVar28 = (MIR_context_t)pcVar55->env[0].__jmpbuf[0];
              if (pMVar28 == (MIR_context_t)0x0) goto LAB_00193608;
            }
            pgVar32 = pMVar28->gen_ctx;
            pcVar52 = (pcVar49->empty_str).s;
            sVar53 = (pcVar49->empty_str).len;
            pVar16 = *(pos_t *)&pgVar32->optimize_level;
            pnVar40 = new_node(pcVar49,N_STR);
            add_pos(pcVar49,pnVar40,pVar16);
            (pnVar40->u).s.s = pcVar52;
            (pnVar40->u).s.len = sVar53;
            pcVar52 = ((pos_t *)&pgVar32->optimize_level)->fname;
            pMVar51 = pgVar32->curr_func_item;
            sVar60 = uniq_cstr(pcVar49,"");
            pcVar58 = sVar60.s;
            pcVar50 = (c2m_ctx_t)0x30;
            pcVar34 = pcVar49;
            pcVar27 = (c2m_ctx_t)reg_malloc(pcVar49,0x30);
            *(undefined4 *)&pcVar27->ctx = 0x102;
            ((pos_t *)&pcVar27->options)->fname = pcVar52;
            pcVar27->env[0].__jmpbuf[0] = (long)pMVar51;
            pcVar27->env[0].__jmpbuf[3] = (long)pcVar58;
            *(undefined4 *)(pcVar27->env[0].__jmpbuf + 1) = 0;
            pcVar27->env[0].__jmpbuf[2] = (long)pnVar40;
            pcVar52 = (char *)pcVar49->temp_string;
            if (((MIR_context_t)pcVar52 != (MIR_context_t)0x0) &&
               (((MIR_context_t)pcVar52)->error_func != (MIR_error_func_t)0x0)) {
              ((MIR_context_t)pcVar52)->gen_ctx = (gen_ctx *)0x0;
              cVar18 = *pcVar58;
              while (cVar18 != '\0') {
                pcVar58 = pcVar58 + 1;
                pVVar14 = pcVar49->temp_string;
                pcVar34 = (c2m_ctx_t)pVVar14->varr;
                if (pcVar34 == (c2m_ctx_t)0x0) goto LAB_001935c2;
                uVar24 = pVVar14->els_num + 1;
                if (pVVar14->size < uVar24) {
                  sVar57 = (uVar24 >> 1) + uVar24;
                  pcVar52 = (char *)realloc(pcVar34,sVar57);
                  pVVar14->varr = pcVar52;
                  pVVar14->size = sVar57;
                }
                sVar53 = pVVar14->els_num;
                pcVar52 = pVVar14->varr;
                pVVar14->els_num = sVar53 + 1;
                *(char *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar53) = cVar18;
                cVar18 = *pcVar58;
              }
              pVVar14 = pcVar49->temp_string;
              pcVar34 = (c2m_ctx_t)pVVar14->varr;
              if (pcVar34 != (c2m_ctx_t)0x0) {
                uVar24 = pVVar14->els_num + 1;
                if (pVVar14->size < uVar24) {
                  sVar57 = (uVar24 >> 1) + uVar24;
                  pcVar52 = (char *)realloc(pcVar34,sVar57);
                  pVVar14->varr = pcVar52;
                  pVVar14->size = sVar57;
                }
                sVar53 = pVVar14->els_num;
                pcVar52 = pVVar14->varr;
                pVVar14->els_num = sVar53 + 1;
                *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar53) = 0x22;
                if (pcVar55->ctx != (MIR_context_t)0x0) {
                  pMVar28 = (MIR_context_t)0x0;
                  do {
                    pptVar25 = (token_t *)pcVar55->env[0].__jmpbuf[0];
                    if (pptVar25 == (token_t *)0x0) goto LAB_001935c7;
                    ptVar23 = pptVar25[(long)pMVar28];
                    uVar2 = *(ushort *)ptVar23;
                    pcVar52 = (char *)(ulong)uVar2;
                    if ((uVar2 == 0x20) || (uVar2 == 10)) {
                      pVVar14 = pcVar49->temp_string;
                      pcVar34 = (c2m_ctx_t)pVVar14->varr;
                      if (pcVar34 == (c2m_ctx_t)0x0) goto LAB_001935d1;
                      uVar24 = pVVar14->els_num + 1;
                      if (pVVar14->size < uVar24) {
                        sVar57 = (uVar24 >> 1) + uVar24;
                        pcVar52 = (char *)realloc(pcVar34,sVar57);
                        pVVar14->varr = pcVar52;
                        pVVar14->size = sVar57;
                      }
                      sVar53 = pVVar14->els_num;
                      pcVar52 = pVVar14->varr;
                      pVVar14->els_num = sVar53 + 1;
                      *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar53) = 0x20;
                    }
                    else {
                      pcVar58 = ptVar23->repr;
                      cVar18 = *pcVar58;
                      if (cVar18 != '\0') {
                        pMVar56 = (MIR_context_t)((long)&pMVar28->gen_ctx + 1);
                        do {
                          pcVar52 = (char *)0x0;
                          if (pcVar55->ctx != pMVar56) {
                            if ((pcVar55->ctx <= pMVar56) ||
                               (pcVar52 = (char *)pcVar55->env[0].__jmpbuf[0],
                               (MIR_context_t)pcVar52 == (MIR_context_t)0x0)) goto LAB_001935b3;
                            pcVar52 = (char *)(ulong)(uint)(int)**(char **)((&((MIR_context_t)
                                                                              pcVar52)->c2mir_ctx)
                                                                            [(long)pMVar28] + 0x28);
                          }
                          if (cVar18 == '\"') {
LAB_00193278:
                            pVVar14 = pcVar49->temp_string;
                            pcVar34 = (c2m_ctx_t)pVVar14->varr;
                            if (pcVar34 == (c2m_ctx_t)0x0) goto LAB_001935b8;
                            uVar24 = pVVar14->els_num + 1;
                            if (pVVar14->size < uVar24) {
                              sVar57 = (uVar24 >> 1) + uVar24;
                              pcVar52 = (char *)realloc(pcVar34,sVar57);
                              pVVar14->varr = pcVar52;
                              pVVar14->size = sVar57;
                            }
                            sVar53 = pVVar14->els_num;
                            pcVar52 = pVVar14->varr;
                            pVVar14->els_num = sVar53 + 1;
                            *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar53) =
                                 0x5c;
                          }
                          else if (cVar18 == '\\') {
                            uVar20 = (uint)pcVar52;
                            if (((0x37 < uVar20 - 0x3f) ||
                                ((0xa880cc20000001U >> ((ulong)(uVar20 - 0x3f) & 0x3f) & 1) == 0))
                               && (bVar59 = (uVar20 & 0xfffffff8) == 0x30,
                                  uVar20 = uVar20 & 0xffffffdf,
                                  pcVar52 = (char *)(ulong)CONCAT31((int3)(uVar20 >> 8),
                                                                    uVar20 == 0x58 || bVar59),
                                  uVar20 != 0x58 && !bVar59)) goto LAB_00193278;
                          }
                          pVVar14 = pcVar49->temp_string;
                          pcVar34 = (c2m_ctx_t)pVVar14->varr;
                          if (pcVar34 == (c2m_ctx_t)0x0) {
                            process_replacement_cold_11();
                            goto LAB_001935ae;
                          }
                          cVar18 = *pcVar58;
                          uVar24 = pVVar14->els_num + 1;
                          if (pVVar14->size < uVar24) {
                            sVar57 = (uVar24 >> 1) + uVar24;
                            pcVar52 = (char *)realloc(pcVar34,sVar57);
                            pVVar14->varr = pcVar52;
                            pVVar14->size = sVar57;
                          }
                          sVar53 = pVVar14->els_num;
                          pcVar52 = pVVar14->varr;
                          pVVar14->els_num = sVar53 + 1;
                          *(char *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar53) = cVar18;
                          cVar18 = pcVar58[1];
                          pcVar58 = pcVar58 + 1;
                        } while (cVar18 != '\0');
                      }
                    }
                    pMVar28 = (MIR_context_t)((long)&pMVar28->gen_ctx + 1);
                  } while (pMVar28 < pcVar55->ctx);
                }
                pVVar14 = pcVar49->temp_string;
                pcVar34 = (c2m_ctx_t)pVVar14->varr;
                if (pcVar34 != (c2m_ctx_t)0x0) {
                  uVar24 = pVVar14->els_num + 1;
                  if (pVVar14->size < uVar24) {
                    pcVar50 = (c2m_ctx_t)((uVar24 >> 1) + uVar24);
                    pcVar55 = pcVar50;
                    pcVar52 = (char *)realloc(pcVar34,(size_t)pcVar50);
                    pVVar14->varr = pcVar52;
                    pVVar14->size = (size_t)pcVar50;
                  }
                  sVar53 = pVVar14->els_num;
                  pcVar52 = pVVar14->varr;
                  pVVar14->els_num = sVar53 + 1;
                  *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar53) = 0x22;
                  pVVar14 = pcVar49->temp_string;
                  pcVar34 = (c2m_ctx_t)pVVar14->varr;
                  if (pcVar34 != (c2m_ctx_t)0x0) {
                    uVar24 = pVVar14->els_num + 1;
                    if (pVVar14->size < uVar24) {
                      pcVar50 = (c2m_ctx_t)((uVar24 >> 1) + uVar24);
                      pcVar55 = pcVar50;
                      pcVar52 = (char *)realloc(pcVar34,(size_t)pcVar50);
                      pVVar14->varr = pcVar52;
                      pVVar14->size = (size_t)pcVar50;
                    }
                    sVar53 = pVVar14->els_num;
                    pcVar52 = pVVar14->varr;
                    pVVar14->els_num = sVar53 + 1;
                    *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar53) = 0;
                    if (pcVar49->temp_string != (VARR_char *)0x0) {
                      sVar60 = uniq_cstr(pcVar49,pcVar49->temp_string->varr);
                      pcVar27->env[0].__jmpbuf[3] = (long)sVar60.s;
                      set_string_val(pcVar49,(token_t)pcVar27,pcVar49->temp_string,0x20);
                      bVar59 = true;
                      goto LAB_00193440;
                    }
                    goto LAB_001935ef;
                  }
                  goto LAB_001935f9;
                }
                goto LAB_001935ea;
              }
              goto LAB_001935e5;
            }
            goto LAB_001935db;
          }
          iVar19 = *(int *)(((c2m_ctx_t)t)->env[0].__jmpbuf + 2);
          lVar26 = (long)iVar19;
          if (((((lVar26 < 2) ||
                (pcVar52 = *(char **)(p_Var5 + lVar26 * 8 + -0x10),
                *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)) &&
               ((iVar19 < 3 ||
                ((**(short **)(p_Var5 + lVar26 * 8 + -0x10) != 0x20 ||
                 (pcVar52 = *(char **)(p_Var5 + lVar26 * 8 + -0x18),
                 *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)))))) &&
              ((iVar22 <= iVar19 ||
               (pcVar52 = *(char **)(p_Var5 + lVar26 * 8),
               *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)))) &&
             (((iVar22 <= iVar19 + 1 ||
               (pcVar52 = *(char **)(p_Var5 + (long)(iVar19 + 1) * 8),
               *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)) ||
              (**(short **)(p_Var5 + lVar26 * 8) != 0x20)))) {
            pcVar52 = ((pos_t *)&pcVar27->options)->fname;
            pptVar25 = (token_t *)pcVar27->env[0].__jmpbuf[0];
            ptVar23 = (token_t)reg_malloc(pcVar49,0x30);
            *(undefined4 *)ptVar23 = 0x144;
            (ptVar23->pos).fname = pcVar52;
            *(token_t **)&(ptVar23->pos).lno = pptVar25;
            ptVar23->repr = "";
            ptVar23->node_code = N_IGNORE;
            ptVar23->node = (node_t_conflict)0x0;
            unget_next_pptoken(pcVar49,ptVar23);
            copy_and_push_back(pcVar49,(VARR_token_t *)pcVar55,*(pos_t *)&((c2m_ctx_t)t)->options);
            pcVar52 = ((pos_t *)&pcVar27->options)->fname;
            pptVar25 = (token_t *)pcVar27->env[0].__jmpbuf[0];
            ptVar23 = (token_t)reg_malloc(pcVar49,0x30);
            *(undefined4 *)ptVar23 = 0x143;
            (ptVar23->pos).fname = pcVar52;
            *(token_t **)&(ptVar23->pos).lno = pptVar25;
            ptVar23->repr = "";
            ptVar23->node_code = N_IGNORE;
            ptVar23->node = (node_t_conflict)0x0;
            unget_next_pptoken(pcVar49,ptVar23);
            return;
          }
          if (pcVar55 == (c2m_ctx_t)0x0) goto LAB_001935bd;
          if (pcVar55->ctx == (MIR_context_t)0x1) {
            pptVar25 = (token_t *)pcVar55->env[0].__jmpbuf[0];
            if (pptVar25 == (token_t *)0x0) goto LAB_001935cc;
            sVar1 = *(short *)*pptVar25;
            if ((sVar1 == 0x20) || (sVar1 == 10)) goto LAB_00192ee5;
          }
          else if (pcVar55->ctx == (MIR_context_t)0x0) {
LAB_00192ee5:
            pcVar52 = ((pos_t *)&pcVar27->options)->fname;
            pptVar25 = (token_t *)pcVar27->env[0].__jmpbuf[0];
            pcVar27 = (c2m_ctx_t)reg_malloc(pcVar49,0x30);
            *(undefined4 *)&pcVar27->ctx = 0x141;
            ((pos_t *)&pcVar27->options)->fname = pcVar52;
            pcVar27->env[0].__jmpbuf[0] = (long)pptVar25;
            pcVar27->env[0].__jmpbuf[3] = (long)"";
            *(undefined4 *)(pcVar27->env[0].__jmpbuf + 1) = 0;
            pcVar27->env[0].__jmpbuf[2] = 0;
            bVar59 = true;
            goto LAB_00193440;
          }
          pcVar34 = (c2m_ctx_t)((c2m_ctx_t)t)->env[0].__jmpbuf[3];
          add_tokens((VARR_token_t *)pcVar34,(VARR_token_t *)pcVar55);
        }
        else {
          if (sVar1 != 0x20) {
            if (sVar1 == 0x23) {
              puVar6 = (uint *)((c2m_ctx_t)t)->env[0].__jmpbuf[3];
              pcVar55 = pcVar27;
              if (puVar6 == (uint *)0x0) goto LAB_001935e0;
              uStack_94 = *puVar6;
            }
            else {
              uStack_94 = 0xffffffff;
            }
          }
          bVar59 = false;
LAB_00193440:
          if (!bVar59) {
            pcVar27 = (c2m_ctx_t)
                      copy_token(pcVar49,(token_t)pcVar27,*(pos_t *)&((c2m_ctx_t)t)->options);
          }
          pcVar34 = (c2m_ctx_t)((c2m_ctx_t)t)->env[0].__jmpbuf[3];
          add_token((VARR_token_t *)pcVar34,(token_t)pcVar27);
        }
        iVar19 = *(int *)(((c2m_ctx_t)t)->env[0].__jmpbuf + 2);
      } while (iVar19 < iVar22);
    }
    ptVar23 = get_next_pptoken_1(pcVar49,0);
    unget_next_pptoken(pcVar49,ptVar23);
    pcVar52 = (ptVar23->pos).fname;
    iVar22 = (ptVar23->pos).lno;
    iVar19 = (ptVar23->pos).ln_pos;
    ptVar23 = (token_t)reg_malloc(pcVar49,0x30);
    *(undefined4 *)ptVar23 = 0x145;
    (ptVar23->pos).fname = pcVar52;
    (ptVar23->pos).lno = iVar22;
    (ptVar23->pos).ln_pos = iVar19;
    ptVar23->repr = "";
    ptVar23->node_code = N_IGNORE;
    ptVar23->node = (node_t_conflict)0x0;
    unget_next_pptoken(pcVar49,ptVar23);
    pVVar7 = (VARR_token_t *)((c2m_ctx_t)t)->env[0].__jmpbuf[3];
    do_concat(pcVar49,pVVar7);
    push_back(pcVar49,pVVar7);
    pMVar4->func_redef_permission_p = 1;
    return;
  }
LAB_001935d6:
  process_replacement_cold_20();
LAB_001935db:
  process_replacement_cold_17();
  pcVar55 = pcVar50;
LAB_001935e0:
  process_replacement_cold_1();
LAB_001935e5:
  process_replacement_cold_16();
LAB_001935ea:
  process_replacement_cold_15();
LAB_001935ef:
  process_replacement_cold_13();
  pcVar50 = pcVar55;
LAB_001935f4:
  pcVar55 = pcVar50;
  process_replacement_cold_18();
LAB_001935f9:
  process_replacement_cold_14();
  pcVar50 = pcVar55;
  pcVar55 = pcVar34;
LAB_001935fe:
  process_replacement_cold_4();
LAB_00193603:
  process_replacement_cold_5();
LAB_00193608:
  process_replacement_cold_6();
  ppVar8 = pcVar55->pre_ctx;
  while( true ) {
    ptVar23 = get_next_pptoken_1(pcVar55,0);
    sVar1 = *(short *)ptVar23;
    if (sVar1 != 0x145) break;
    pop_macro_call(pcVar55);
  }
  if ((sVar1 == 10) || (sVar1 == 0x20)) {
    t_00 = get_next_pptoken_1(pcVar55,0);
    t_02 = ptVar23;
  }
  else {
    t_02 = (token_t)0x0;
    t_00 = ptVar23;
  }
  if (*(short *)t_00 != 0x28) {
    unget_next_pptoken(pcVar55,t_00);
    if (t_02 != (token_t)0x0) {
      unget_next_pptoken(pcVar55,t_02);
    }
    out_token(pcVar55,t_01);
    return;
  }
  pcVar49 = (c2m_ctx_t)(t_01->pos).fname;
  pmVar29 = new_macro_call((macro_t)pcVar50,t_01->pos);
  pmVar9 = pmVar29->macro;
  pMVar51 = (MIR_item_t)&DAT_00000018;
  pVVar30 = (VARR_token_arr_t *)malloc(0x18);
  if (pVVar30 == (VARR_token_arr_t *)0x0) {
LAB_00193c1e:
    mir_varr_error((char *)pMVar51);
  }
  pVVar30->els_num = 0;
  pVVar30->size = 0x10;
  ppVVar31 = (token_arr_t *)malloc(0x80);
  pVVar30->varr = ppVVar31;
  pMVar51 = (MIR_item_t)&DAT_00000018;
  pgVar32 = (gen_ctx *)malloc(0x18);
  if (pgVar32 == (gen_ctx *)0x0) goto LAB_00193c1e;
  pgVar32->ctx = (MIR_context_t)0x0;
  ((pos_t *)&pgVar32->optimize_level)->fname = (char *)0x10;
  pMVar51 = (MIR_item_t)0x80;
  pMVar33 = (MIR_item_t)malloc(0x80);
  pgVar32->curr_func_item = pMVar33;
  pVVar7 = pmVar9->params;
  if (pVVar7 == (VARR_token_t *)0x0) {
LAB_00193c37:
    try_param_macro_call_cold_17();
LAB_00193c3c:
    try_param_macro_call_cold_15();
    goto LAB_00193c41;
  }
  uVar24 = pVVar7->els_num;
  uVar48 = 0;
  uVar20 = 0;
  if (uVar24 != 1) {
LAB_00193740:
    bVar59 = false;
    do {
      pcVar49 = (c2m_ctx_t)0x0;
      pcVar34 = (c2m_ctx_t)get_next_pptoken_1(pcVar55,0);
      if (*(short *)&pcVar34->ctx == 0x145) {
        pcVar49 = (c2m_ctx_t)0x0;
        pcVar34 = (c2m_ctx_t)get_next_pptoken_1(pcVar55,0);
        pop_macro_call(pcVar55);
      }
      uVar21 = *(uint *)&pcVar34->ctx & 0xffff;
      uVar45 = *(uint *)&pcVar34->ctx * 0x10000;
      pcVar52 = (char *)(ulong)uVar45;
      uVar47 = uVar45 + 0xfec30000 >> 0x10;
      if ((((uVar47 < 0xb) && (pcVar49 = (c2m_ctx_t)0x5c1, (0x5c1U >> (uVar47 & 0x1f) & 1) != 0)) ||
          (pcVar52 = (char *)(ulong)CONCAT31((int3)(uVar45 >> 8),uVar45 == 0x230000),
          (bool)(bVar59 & uVar45 == 0x230000))) ||
         (uVar45 = uVar21 ^ 0x29 | uVar48, pcVar52 = (char *)(ulong)uVar45, uVar45 == 0)) {
        if (uVar21 != 0x29) {
          in_R8 = (char **)pmVar9->id->repr;
          pcVar52 = "unfinished call of macro %s";
          error(pcVar55,0x1c3620,(char *)pcVar34->options,pcVar34->env[0].__jmpbuf[0]);
          pcVar49 = pcVar34;
          unget_next_pptoken(pcVar55,(token_t)pcVar34);
        }
        pMVar51 = (MIR_item_t)pVVar30->varr;
        if (pMVar51 == (MIR_item_t)0x0) goto LAB_00193c3c;
        uVar35 = pVVar30->els_num + 1;
        if (pVVar30->size < uVar35) {
          sVar53 = (uVar35 >> 1) + uVar35;
          pcVar49 = (c2m_ctx_t)(sVar53 * 8);
          ppVVar31 = (token_arr_t *)realloc(pMVar51,(size_t)pcVar49);
          pVVar30->varr = ppVVar31;
          pVVar30->size = sVar53;
        }
        uVar11 = pVVar30->els_num;
        uVar35 = uVar11 + 1;
        pVVar30->els_num = uVar35;
        pVVar30->varr[uVar11] = (token_arr_t)pgVar32;
        pcVar52 = (char *)(uVar11 | uVar24);
        if ((MIR_context_t)pcVar52 == (MIR_context_t)0x0) {
          pcVar52 = (char *)pVVar30->varr;
          if ((MIR_context_t)pcVar52 == (MIR_context_t)0x0) goto LAB_00193c55;
          pgVar32 = ((MIR_context_t)pcVar52)->gen_ctx;
          if (pgVar32 == (gen_ctx *)0x0) goto LAB_00193c5a;
          pcVar49 = (c2m_ctx_t)pgVar32->ctx;
          if (pcVar49 == (c2m_ctx_t)0x0) {
LAB_00193b7d:
            pVVar30->els_num = uVar11;
            pgVar32 = (&((MIR_context_t)pcVar52)->gen_ctx)[uVar11];
            if ((pgVar32 == (gen_ctx *)0x0) ||
               (pMVar51 = pgVar32->curr_func_item, pMVar51 == (MIR_item_t)0x0)) goto LAB_00193c5f;
            free(pMVar51);
            free(pgVar32);
            goto LAB_00193ba7;
          }
          if (pcVar49 == (c2m_ctx_t)&DAT_00000001) {
            if (pgVar32->curr_func_item == (MIR_item_t)0x0) goto LAB_00193c69;
            if (*pgVar32->curr_func_item->data == 0x20) goto LAB_00193b7d;
          }
        }
        if (uVar35 <= uVar24) {
          if (uVar24 <= uVar35) goto LAB_00193ba7;
          pMStack_108 = (MIR_context_t)0x1c365f;
          goto LAB_00193a8a;
        }
        if (pVVar30->varr == (token_arr_t *)0x0) goto LAB_00193c4b;
        pVVar12 = pVVar30->varr[uVar24];
        if (pVVar12 == (token_arr_t)0x0) goto LAB_00193c50;
        if (pVVar12->els_num != 0) {
          if (pVVar12->varr == (token_t *)0x0) goto LAB_00193c64;
          pcVar34 = (c2m_ctx_t)*pVVar12->varr;
        }
        pMStack_108 = (MIR_context_t)0x1c363c;
        goto LAB_00193a2f;
      }
      pcVar52 = (char *)(ulong)(uVar48 | uVar20);
      if (uVar21 == 0x2c && (uVar48 | uVar20) == 0) {
        pMVar51 = (MIR_item_t)pVVar30->varr;
        if (pMVar51 == (MIR_item_t)0x0) goto LAB_00193c32;
        uVar35 = pVVar30->els_num + 1;
        if (pVVar30->size < uVar35) {
          sVar53 = (uVar35 >> 1) + uVar35;
          pcVar49 = (c2m_ctx_t)(sVar53 * 8);
          ppVVar31 = (token_arr_t *)realloc(pMVar51,(size_t)pcVar49);
          pVVar30->varr = ppVVar31;
          pVVar30->size = sVar53;
        }
        sVar10 = pVVar30->els_num;
        pcVar52 = (char *)pVVar30->varr;
        sVar53 = sVar10 + 1;
        pVVar30->els_num = sVar53;
        (&((MIR_context_t)pcVar52)->gen_ctx)[sVar10] = pgVar32;
        pMVar51 = (MIR_item_t)&DAT_00000018;
        pgVar32 = (gen_ctx *)malloc(0x18);
        if (pgVar32 == (gen_ctx *)0x0) goto LAB_00193c1e;
        pgVar32->ctx = (MIR_context_t)0x0;
        ((pos_t *)&pgVar32->optimize_level)->fname = (char *)0x10;
        pMVar51 = (MIR_item_t)0x80;
        pMVar33 = (MIR_item_t)malloc(0x80);
        pgVar32->curr_func_item = pMVar33;
        uVar48 = 0;
        if (sVar53 == uVar24 - 1) {
          pVVar7 = pmVar9->params;
          if (((pVVar7 == (VARR_token_t *)0x0) ||
              (pcVar52 = (char *)pVVar7->varr, (MIR_context_t)pcVar52 == (MIR_context_t)0x0)) ||
             (pVVar7->els_num <= uVar24 - 1)) goto LAB_00193c28;
          iVar22 = strcmp(*(char **)(*(long *)((long)pcVar52 + uVar24 * 8 + -8) + 0x28),"...");
          uVar20 = (uint)(iVar22 == 0);
        }
        else {
          uVar20 = 0;
        }
      }
      else {
        pMVar51 = pgVar32->curr_func_item;
        if (pMVar51 == (MIR_item_t)0x0) goto LAB_00193c2d;
        pcVar52 = (char *)((long)&pgVar32->ctx->gen_ctx + 1);
        if (((pos_t *)&pgVar32->optimize_level)->fname < pcVar52) {
          pMVar51 = (MIR_item_t)realloc(pMVar51,(long)(pcVar52 + ((ulong)pcVar52 >> 1)) * 8);
          pgVar32->curr_func_item = pMVar51;
          ((pos_t *)&pgVar32->optimize_level)->fname = pcVar52 + ((ulong)pcVar52 >> 1);
        }
        pMVar4 = pgVar32->ctx;
        pgVar32->ctx = (MIR_context_t)((long)&pMVar4->gen_ctx + 1);
        (&pgVar32->curr_func_item->data)[(long)pMVar4] = pcVar34;
        if (*(short *)&pcVar34->ctx == 0x28) {
          uVar48 = uVar48 + 1;
        }
        else if (*(short *)&pcVar34->ctx == 0x29) {
          uVar48 = uVar48 - 1;
        }
      }
      bVar59 = *(short *)&pcVar34->ctx == 10;
    } while( true );
  }
  if (pVVar7->varr != (token_t *)0x0) {
    uVar20 = (uint)(*(short *)*pVVar7->varr == 0x10f);
    goto LAB_00193740;
  }
  goto LAB_00193c46;
LAB_00193a8a:
  pMVar51 = (MIR_item_t)&DAT_00000018;
  pgVar32 = (gen_ctx *)malloc(0x18);
  if (pgVar32 != (gen_ctx *)0x0) {
    pgVar32->ctx = (MIR_context_t)0x0;
    ((pos_t *)&pgVar32->optimize_level)->fname = (char *)0x10;
    pMVar51 = (MIR_item_t)malloc(0x80);
    pgVar32->curr_func_item = pMVar51;
    pMVar51 = (MIR_item_t)pVVar30->varr;
    if (pMVar51 != (MIR_item_t)0x0) goto code_r0x00193aca;
    try_param_macro_call_cold_6();
LAB_00193c28:
    try_param_macro_call_cold_2();
LAB_00193c2d:
    try_param_macro_call_cold_1();
LAB_00193c32:
    try_param_macro_call_cold_3();
    goto LAB_00193c37;
  }
  goto LAB_00193c1e;
code_r0x00193aca:
  uVar35 = uVar35 + 1;
  if (pVVar30->size < uVar35) {
    sVar53 = (uVar35 >> 1) + uVar35;
    pcVar49 = (c2m_ctx_t)(sVar53 * 8);
    ppVVar31 = (token_arr_t *)realloc(pMVar51,(size_t)pcVar49);
    pVVar30->varr = ppVVar31;
    pVVar30->size = sVar53;
  }
  sVar53 = pVVar30->els_num;
  pcVar52 = (char *)pVVar30->varr;
  uVar35 = sVar53 + 1;
  pVVar30->els_num = uVar35;
  (&((MIR_context_t)pcVar52)->gen_ctx)[sVar53] = pgVar32;
  if (uVar24 <= uVar35) goto LAB_00193b11;
  goto LAB_00193a8a;
  while( true ) {
    ppgVar17 = &pMVar54->gen_ctx;
    pMVar54 = (MIR_context_t)((long)&pMVar54->gen_ctx + 1);
    if (pptVar25[(long)((long)ppgVar17 + 1)]->node_code == N_GT) break;
LAB_00193d8d:
    pcVar50 = (c2m_ctx_t)((long)pcVar27->env[0].__jmpbuf + (long)&pMVar54[-1].setjmp_addr);
    if (pcVar50 == (c2m_ctx_t)&DAT_00000001) goto LAB_0019413a;
  }
  pcVar50 = (c2m_ctx_t)
            CONCAT71((int7)((ulong)pptVar25[(long)((long)ppgVar17 + 1)] >> 8),pMVar54 < pMVar4);
LAB_00193db0:
  if ((char)pcVar50 == '\0') goto LAB_0019413a;
  pVVar14 = pcVar34->symbol_text;
  if ((pVVar14 == (VARR_char *)0x0) ||
     (pcVar27 = (c2m_ctx_t)pVVar14->varr, pcVar27 == (c2m_ctx_t)0x0)) goto LAB_001941ef;
  pVVar14->els_num = 0;
  pVVar15 = pcVar34->temp_string;
  if ((pVVar15 == (VARR_char *)0x0) || (pVVar15->varr == (char *)0x0)) goto LAB_001941f4;
  pVVar15->els_num = 0;
  uVar24 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar24) {
    pcVar55 = (c2m_ctx_t)((uVar24 >> 1) + uVar24);
    pcVar50 = pcVar55;
    pcVar38 = (char *)realloc(pcVar27,(size_t)pcVar55);
    pVVar14->varr = pcVar38;
    pVVar14->size = (size_t)pcVar55;
  }
  sVar53 = pVVar14->els_num;
  pVVar14->els_num = sVar53 + 1;
  pVVar14->varr[sVar53] = '<';
  if (pMVar56 < pMVar54) {
    do {
      lVar26 = pcVar49->env[0].__jmpbuf[0];
      if ((lVar26 == 0) || (pcVar49->ctx <= pMVar56)) goto LAB_001941ea;
      pcVar38 = *(char **)(*(long *)(lVar26 + (long)pMVar56 * 8) + 0x28);
      cVar18 = *pcVar38;
      while (cVar18 != '\0') {
        pVVar14 = pcVar34->symbol_text;
        pcVar27 = (c2m_ctx_t)pVVar14->varr;
        if (pcVar27 == (c2m_ctx_t)0x0) {
LAB_001941d1:
          get_header_name_cold_2();
          goto LAB_001941d6;
        }
        uVar24 = pVVar14->els_num + 1;
        if (pVVar14->size < uVar24) {
          pcVar55 = (c2m_ctx_t)((uVar24 >> 1) + uVar24);
          pcVar50 = pcVar55;
          pcVar39 = (char *)realloc(pcVar27,(size_t)pcVar55);
          pVVar14->varr = pcVar39;
          pVVar14->size = (size_t)pcVar55;
        }
        sVar53 = pVVar14->els_num;
        pVVar14->els_num = sVar53 + 1;
        pVVar14->varr[sVar53] = cVar18;
        pVVar14 = pcVar34->temp_string;
        pcVar27 = (c2m_ctx_t)pVVar14->varr;
        if (pcVar27 == (c2m_ctx_t)0x0) {
          get_header_name_cold_1();
          goto LAB_001941d1;
        }
        cVar18 = *pcVar38;
        uVar24 = pVVar14->els_num + 1;
        if (pVVar14->size < uVar24) {
          pcVar55 = (c2m_ctx_t)((uVar24 >> 1) + uVar24);
          pcVar50 = pcVar55;
          pcVar39 = (char *)realloc(pcVar27,(size_t)pcVar55);
          pVVar14->varr = pcVar39;
          pVVar14->size = (size_t)pcVar55;
        }
        sVar53 = pVVar14->els_num;
        pVVar14->els_num = sVar53 + 1;
        pVVar14->varr[sVar53] = cVar18;
        cVar18 = pcVar38[1];
        pcVar38 = pcVar38 + 1;
      }
      pMVar56 = (MIR_context_t)((long)&pMVar56->gen_ctx + 1);
    } while (pMVar56 != pMVar54);
  }
  pVVar14 = pcVar34->symbol_text;
  pcVar27 = (c2m_ctx_t)pVVar14->varr;
  if (pcVar27 == (c2m_ctx_t)0x0) goto LAB_001941fe;
  uVar24 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar24) {
    pcVar55 = (c2m_ctx_t)((uVar24 >> 1) + uVar24);
    pcVar50 = pcVar55;
    pcVar38 = (char *)realloc(pcVar27,(size_t)pcVar55);
    pVVar14->varr = pcVar38;
    pVVar14->size = (size_t)pcVar55;
  }
  sVar53 = pVVar14->els_num;
  pVVar14->els_num = sVar53 + 1;
  pVVar14->varr[sVar53] = '>';
  pVVar14 = pcVar34->symbol_text;
  pcVar27 = (c2m_ctx_t)pVVar14->varr;
  if (pcVar27 == (c2m_ctx_t)0x0) goto LAB_00194203;
  uVar24 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar24) {
    pcVar55 = (c2m_ctx_t)((uVar24 >> 1) + uVar24);
    pcVar50 = pcVar55;
    pcVar38 = (char *)realloc(pcVar27,(size_t)pcVar55);
    pVVar14->varr = pcVar38;
    pVVar14->size = (size_t)pcVar55;
  }
  sVar53 = pVVar14->els_num;
  pVVar14->els_num = sVar53 + 1;
  pVVar14->varr[sVar53] = '\0';
  pVVar14 = pcVar34->temp_string;
  pcVar27 = (c2m_ctx_t)pVVar14->varr;
  if (pcVar27 == (c2m_ctx_t)0x0) goto LAB_00194208;
  uVar24 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar24) {
    sVar57 = (uVar24 >> 1) + uVar24;
    pcVar38 = (char *)realloc(pcVar27,sVar57);
    pVVar14->varr = pcVar38;
    pVVar14->size = sVar57;
  }
  sVar53 = pVVar14->els_num;
  pVVar14->els_num = sVar53 + 1;
  pVVar14->varr[sVar53] = '\0';
  pcVar50 = (c2m_ctx_t)((ulong)pMVar28 & 0xffffffff);
  pcVar27 = pcVar49;
  del_tokens((VARR_token_t *)pcVar49,(int)pMVar28,(int)pMVar54 - (int)pMVar28);
  if (pcVar34->symbol_text != (VARR_char *)0x0) {
    if (pcVar34->temp_string == (VARR_char *)0x0) goto LAB_00194212;
    pcVar38 = pcVar34->symbol_text->varr;
    sVar60 = uniq_cstr(pcVar34,pcVar34->temp_string->varr);
    pnVar40 = new_node(pcVar34,N_STR);
    add_pos(pcVar34,pnVar40,pVar16);
    pcStack_1a0 = sVar60.s;
    (pnVar40->u).l = (mir_long)pcStack_1a0;
    sStack_198 = sVar60.len;
    (pnVar40->u).s.len = sStack_198;
    sVar60 = uniq_cstr(pcVar34,pcVar38);
    pcVar50 = (c2m_ctx_t)0x30;
    pcVar27 = pcVar34;
    puVar41 = (undefined4 *)reg_malloc(pcVar34,0x30);
    *puVar41 = 0x13e;
    *(char **)(puVar41 + 2) = pcVar58;
    *(token_t **)(puVar41 + 4) = pptVar13;
    *(char **)(puVar41 + 10) = sVar60.s;
    puVar41[6] = 0;
    *(node_t_conflict *)(puVar41 + 8) = pnVar40;
    lVar26 = pcVar49->env[0].__jmpbuf[0];
    if ((lVar26 != 0) && (pMVar28 < pcVar49->ctx)) {
      *(undefined4 **)(lVar26 + (long)pMVar28 * 8) = puVar41;
      goto LAB_0019413a;
    }
    goto LAB_001941f9;
  }
  goto LAB_0019420d;
  while( true ) {
    pVVar30->els_num = uVar35 - 1;
    pMVar33 = (MIR_item_t)pVVar30->varr[uVar35 - 1];
    if ((pMVar33 == (MIR_item_t)0x0) ||
       (pMVar51 = (pMVar33->item_link).prev, pMVar51 == (MIR_item_t)0x0)) {
      try_param_macro_call_cold_9();
      goto LAB_00193c19;
    }
    free(pMVar51);
    free(pMVar33);
    uVar35 = pVVar30->els_num;
    pMVar51 = pMVar33;
    if (uVar35 <= uVar24) break;
LAB_00193a2f:
    if (pVVar30->varr == (token_arr_t *)0x0) {
LAB_00193c19:
      try_param_macro_call_cold_10();
      goto LAB_00193c1e;
    }
  }
LAB_00193b11:
  in_R8 = (char **)pmVar9->id->repr;
  pcVar49 = (c2m_ctx_t)((pos_t *)&pcVar34->options)->fname;
  error(pcVar55,pMStack_108,(char *)pcVar49,pcVar34->env[0].__jmpbuf[0]);
  pcVar52 = (char *)pMStack_108;
LAB_00193ba7:
  pmVar29->args = pVVar30;
  pVVar3 = ppVar8->macro_call_stack;
  pMVar51 = (MIR_item_t)pVVar3->varr;
  if (pMVar51 != (MIR_item_t)0x0) {
    uVar24 = pVVar3->els_num + 1;
    if (pVVar3->size < uVar24) {
      sVar53 = (uVar24 >> 1) + uVar24;
      ppmVar36 = (macro_call_t *)realloc(pMVar51,sVar53 * 8);
      pVVar3->varr = ppmVar36;
      pVVar3->size = sVar53;
    }
    sVar53 = pVVar3->els_num;
    pVVar3->els_num = sVar53 + 1;
    pVVar3->varr[sVar53] = pmVar29;
    return;
  }
LAB_00193c41:
  try_param_macro_call_cold_8();
LAB_00193c46:
  try_param_macro_call_cold_16();
LAB_00193c4b:
  try_param_macro_call_cold_12();
LAB_00193c50:
  try_param_macro_call_cold_11();
LAB_00193c55:
  try_param_macro_call_cold_14();
LAB_00193c5a:
  try_param_macro_call_cold_13();
LAB_00193c5f:
  try_param_macro_call_cold_5();
LAB_00193c64:
  try_param_macro_call_cold_7();
LAB_00193c69:
  try_param_macro_call_cold_4();
  pMVar51 = pMVar51[5].item_link.prev;
  pcVar34 = (c2m_ctx_t)(pMVar51->item_link).prev;
  if (pcVar34 != (c2m_ctx_t)0x0) {
    puVar37 = &((token_t)pMVar51->data)->field_0x1;
    if (pMVar51->module < puVar37) {
      pMVar33 = (MIR_item_t)realloc(pcVar34,(long)(puVar37 + ((ulong)puVar37 >> 1)) * 8);
      (pMVar51->item_link).prev = pMVar33;
      pMVar51->module = (MIR_module_t)(puVar37 + ((ulong)puVar37 >> 1));
    }
    ptVar23 = (token_t)pMVar51->data;
    pMVar51->data = &ptVar23->field_0x1;
    (&((pMVar51->item_link).prev)->data)[(long)ptVar23] = pcVar49;
    return;
  }
  unget_next_pptoken_cold_1();
  if (((pcVar34 != (c2m_ctx_t)0x0) && (pcVar34->env[0].__jmpbuf[0] != 0)) &&
     (pcVar52 = (char *)pcVar34->ctx, (MIR_context_t)pcVar52 != (MIR_context_t)0x0)) {
    return;
  }
  VARR_token_arr_tlast_cold_1();
  *in_R8 = (char *)0x0;
  pcVar50 = pcVar49;
  pcVar27 = pcVar34;
  if (pcVar49 == (c2m_ctx_t)0x0) {
LAB_001941d6:
    get_header_name_cold_15();
LAB_001941db:
    get_header_name_cold_12();
LAB_001941e0:
    get_header_name_cold_13();
  }
  else {
    pMVar4 = pcVar49->ctx;
    if (pMVar4 != (MIR_context_t)0x0) {
      pptVar25 = (token_t *)pcVar49->env[0].__jmpbuf[0];
      if (pptVar25 == (token_t *)0x0) goto LAB_001941db;
      pMVar28 = (MIR_context_t)0x0;
      do {
        pcVar27 = (c2m_ctx_t)pptVar25[(long)pMVar28];
        if (*(short *)&pcVar27->ctx != 0x20) {
          if ((pMVar28 < pMVar4) && (*(int *)(pcVar27->env[0].__jmpbuf + 1) == 0x17)) {
            pMVar56 = (MIR_context_t)((long)&pMVar28->gen_ctx + 1);
            pcVar50 = (c2m_ctx_t)CONCAT71((int7)((ulong)pcVar49 >> 8),pMVar56 < pMVar4);
            if (pMVar56 < pMVar4) {
              pcVar58 = ((pos_t *)&pcVar27->options)->fname;
              pptVar13 = (token_t *)pcVar27->env[0].__jmpbuf[0];
              pVar16 = *(pos_t *)&pcVar27->options;
              pcVar27 = (c2m_ctx_t)pptVar25[(long)((long)&pMVar28->gen_ctx + 1)];
              pMVar54 = pMVar56;
              if (*(int *)(pcVar27->env[0].__jmpbuf + 1) == 0x19) goto LAB_00193db0;
              pcVar27 = (c2m_ctx_t)(2 - (long)pMVar4);
              goto LAB_00193d8d;
            }
          }
          break;
        }
        pMVar28 = (MIR_context_t)((long)&pMVar28->gen_ctx + 1);
      } while (pMVar4 != pMVar28);
    }
LAB_0019413a:
    pcVar55 = (c2m_ctx_t)pcVar49->ctx;
    if (pcVar55 == (c2m_ctx_t)0x0) {
      pcVar46 = (c2m_ctx_t)0x0;
    }
    else {
      puVar43 = (undefined8 *)pcVar49->env[0].__jmpbuf[0];
      if (puVar43 == (undefined8 *)0x0) goto LAB_001941e0;
      pcVar46 = (c2m_ctx_t)(ulong)(*(short *)*puVar43 == 0x20);
    }
    pcVar50 = (c2m_ctx_t)((long)&pcVar55[-1].gen_ctx + 7);
    if (pcVar46 != pcVar50) {
LAB_001941a4:
      error(pcVar34,0x1c3085,format,pcVar52);
      return;
    }
    if ((pcVar46 < pcVar55) && (lVar26 = pcVar49->env[0].__jmpbuf[0], lVar26 != 0)) {
      ptVar23 = *(token_t *)(lVar26 + (long)pcVar46 * 8);
      sVar1 = *(short *)ptVar23;
      if ((sVar1 == 0x102) || (sVar1 == 0x13e)) {
        get_include_fname(pcVar34,ptVar23,in_R8);
        return;
      }
      goto LAB_001941a4;
    }
  }
  get_header_name_cold_14();
LAB_001941ea:
  get_header_name_cold_9();
LAB_001941ef:
  get_header_name_cold_11();
LAB_001941f4:
  get_header_name_cold_10();
LAB_001941f9:
  get_header_name_cold_3();
LAB_001941fe:
  get_header_name_cold_8();
LAB_00194203:
  get_header_name_cold_7();
LAB_00194208:
  get_header_name_cold_6();
LAB_0019420d:
  get_header_name_cold_5();
LAB_00194212:
  get_header_name_cold_4();
  plVar42 = (long *)malloc(0x30);
  *plVar42 = (long)pcVar27;
  plVar42[1] = (long)pcVar50;
  plVar42[2] = extraout_RDX;
  *(undefined4 *)(plVar42 + 4) = 0;
  plVar42[3] = 0;
  pcVar52 = &DAT_00000018;
  puVar43 = (undefined8 *)malloc(0x18);
  plVar42[5] = (long)puVar43;
  if (puVar43 == (undefined8 *)0x0) {
    mir_varr_error(pcVar52);
  }
  *puVar43 = 0;
  puVar43[1] = 0x40;
  pvVar44 = malloc(0x200);
  puVar43[2] = pvVar44;
  return;
}

Assistant:

static void skip_nl (c2m_ctx_t c2m_ctx, token_t t,
                     VARR (token_t) * buffer) { /* skip until new line */
  if (t == NULL) t = get_next_pptoken (c2m_ctx);
  for (; t->code != '\n' && t->code != T_EOU; t = get_next_pptoken (c2m_ctx))  // ??>
    if (buffer != NULL) VARR_PUSH (token_t, buffer, t);
  unget_next_pptoken (c2m_ctx, t);
}